

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dots.c
# Opt level: O1

int makeDots(float radius,point3d *points,int maxpnts)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double *pdVar6;
  int iVar7;
  long lVar8;
  bool bVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  dVar14 = (double)maxpnts * 3.14159265359;
  if (dVar14 < 0.0) {
    dVar14 = sqrt(dVar14);
  }
  else {
    dVar14 = SQRT(dVar14);
  }
  dVar14 = floor(dVar14);
  iVar5 = (int)dVar14;
  iVar4 = 0;
  if (-2 < iVar5) {
    bVar2 = true;
    lVar8 = 0;
    iVar3 = 0;
    do {
      dVar14 = ((double)iVar3 * 3.14159265359) / (double)(iVar5 / 2);
      dVar10 = cos(dVar14);
      dVar10 = dVar10 * (double)radius;
      dVar11 = sin(dVar14);
      dVar11 = dVar11 * (double)radius;
      dVar14 = sin(dVar14);
      dVar14 = floor(dVar14 * (double)iVar5);
      iVar1 = (int)dVar14;
      if ((int)dVar14 < 2) {
        iVar1 = 1;
      }
      iVar4 = (int)lVar8;
      lVar8 = (long)iVar4;
      pdVar6 = &points[lVar8].z;
      dVar14 = 0.0;
      iVar7 = 0;
      do {
        if (bVar2) {
          dVar12 = dVar14 * 6.28318530718 + 0.20000000298023224;
        }
        else {
          dVar12 = dVar14 * 6.28318530718;
        }
        dVar13 = cos(dVar12 / (double)iVar1);
        dVar12 = sin(dVar12 / (double)iVar1);
        if (maxpnts <= lVar8) goto LAB_00122a0d;
        dVar12 = dVar12 * dVar11;
        ((point3d *)(pdVar6 + -2))->x = dVar13 * dVar11;
        pdVar6[-1] = dVar12 * 0.9990482215818577 + dVar10 * -0.043619387365338866;
        *pdVar6 = dVar12 * 0.043619387365338866 + dVar10 * 0.9990482215818577;
        lVar8 = lVar8 + 1;
        dVar14 = dVar14 + 1.0;
        iVar7 = iVar7 + -1;
        pdVar6 = pdVar6 + 3;
      } while (-iVar1 != iVar7);
      bVar2 = (bool)(bVar2 ^ 1);
      bVar9 = iVar3 != iVar5 / 2;
      iVar3 = iVar3 + 1;
    } while (bVar9);
LAB_00122a0d:
    iVar4 = iVar4 - iVar7;
  }
  return iVar4;
}

Assistant:

int makeDots(float radius, point3d points[], int maxpnts) {
   float offset = 0.2;
   double ang, cosang, sinang, phi, theta, xy0, x0, y0, z0;
   int i, j, k, odd, nequator, nvert, nhoriz;

   nequator = (int)floor(sqrt(maxpnts * PI));

   odd = 1;
   ang = 5.0 * PI / 360.0;
   cosang = cos(ang);
   sinang = sin(ang);

   i = 0;
   nvert = nequator / 2;
   for (j = 0; j <= nvert; j++) {
      phi = (PI * j) / nvert;
      z0 = cos(phi) * radius;
      xy0= sin(phi) * radius;

      nhoriz = (int)floor(nequator * sin(phi));
      if (nhoriz < 1) nhoriz = 1;
      for (k = 0; k < nhoriz; k++) {
	 if(odd) {theta = (2.0 * PI * k + offset)/nhoriz; }
	 else    {theta = (2.0 * PI * k         )/nhoriz; }
	 x0 = cos(theta) * xy0;
	 y0 = sin(theta) * xy0;

	 if (i >= maxpnts) return i;
	 points[i].x = x0;
	 points[i].y = y0*cosang - z0*sinang;
	 points[i].z = y0*sinang + z0*cosang;
	 i++;
      }
      odd = !odd;
   }
   return i;
}